

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv6Transmitter::Create
          (RTPUDPv6Transmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  list<in6_addr,_std::allocator<in6_addr>_> *this_00;
  RTPAbortDescriptors *pRVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ushort uVar7;
  RTPUDPv6TransmissionParams *pRVar8;
  uint size;
  sockaddr local_a4;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  RTPUDPv6TransmissionParams defaultparams;
  
  RTPUDPv6TransmissionParams::RTPUDPv6TransmissionParams(&defaultparams);
  if (this->init == true) {
    if (this->created == false) {
      pRVar8 = &defaultparams;
      if ((transparams == (RTPTransmissionParams *)0x0) ||
         (pRVar8 = (RTPUDPv6TransmissionParams *)transparams, transparams->protocol == IPv6UDPProto)
         ) {
        if (((pRVar8->super_RTPTransmissionParams).field_0xc & 1) == 0) {
          iVar5 = socket(10,2,0);
          this->rtpsock = iVar5;
          iVar6 = -99;
          if (iVar5 != -1) {
            iVar5 = socket(10,2,0);
            this->rtcpsock = iVar5;
            if (iVar5 == -1) {
              close(this->rtpsock);
            }
            else {
              size = pRVar8->rtprecvbuf;
              iVar6 = setsockopt(this->rtpsock,1,8,&size,4);
              if (iVar6 == 0) {
                size = pRVar8->rtpsendbuf;
                iVar6 = setsockopt(this->rtpsock,1,7,&size,4);
                if (iVar6 == 0) {
                  size = pRVar8->rtcprecvbuf;
                  iVar6 = setsockopt(this->rtcpsock,1,8,&size,4);
                  if (iVar6 == 0) {
                    size = pRVar8->rtcpsendbuf;
                    iVar6 = setsockopt(this->rtcpsock,1,7,&size,4);
                    if (iVar6 == 0) {
                      uVar2 = *(undefined8 *)((long)&(pRVar8->bindIP).__in6_u + 8);
                      *(undefined8 *)&(this->bindIP).__in6_u =
                           *(undefined8 *)&(pRVar8->bindIP).__in6_u;
                      *(undefined8 *)((long)&(this->bindIP).__in6_u + 8) = uVar2;
                      this->mcastifidx = pRVar8->mcastifidx;
                      local_a4.sa_data[2] = '\0';
                      local_a4.sa_data[3] = '\0';
                      local_a4.sa_data[4] = '\0';
                      local_a4.sa_data[5] = '\0';
                      uStack_8c = 0;
                      local_a4.sa_family = 10;
                      uVar7 = *(ushort *)&(pRVar8->super_RTPTransmissionParams).field_0xc;
                      local_a4.sa_data._0_2_ = uVar7 << 8 | uVar7 >> 8;
                      uVar2 = *(undefined8 *)&(this->bindIP).__in6_u;
                      uVar3 = *(undefined8 *)((long)&(this->bindIP).__in6_u + 8);
                      local_a4.sa_data._6_4_ = SUB84(uVar2,0);
                      local_a4.sa_data._10_4_ = SUB84((ulong)uVar2 >> 0x20,0);
                      uStack_94 = (undefined4)uVar3;
                      local_90 = (undefined4)((ulong)uVar3 >> 0x20);
                      iVar6 = bind(this->rtpsock,&local_a4,0x1c);
                      if (iVar6 == 0) {
                        local_a4.sa_data[2] = '\0';
                        local_a4.sa_data[3] = '\0';
                        local_a4.sa_data[4] = '\0';
                        local_a4.sa_data[5] = '\0';
                        uStack_8c = 0;
                        local_a4.sa_family = 10;
                        uVar7 = (short)*(undefined4 *)
                                        &(pRVar8->super_RTPTransmissionParams).field_0xc + 1;
                        local_a4.sa_data._0_2_ = uVar7 * 0x100 | uVar7 >> 8;
                        uVar2 = *(undefined8 *)&(this->bindIP).__in6_u;
                        uVar3 = *(undefined8 *)((long)&(this->bindIP).__in6_u + 8);
                        local_a4.sa_data._6_4_ = SUB84(uVar2,0);
                        local_a4.sa_data._10_4_ = SUB84((ulong)uVar2 >> 0x20,0);
                        uStack_94 = (undefined4)uVar3;
                        local_90 = (undefined4)((ulong)uVar3 >> 0x20);
                        iVar6 = bind(this->rtcpsock,&local_a4,0x1c);
                        if (iVar6 == 0) {
                          this_00 = &this->localIPs;
                          std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::operator=
                                    (this_00,&pRVar8->localIPs);
                          if ((this_00->super__List_base<in6_addr,_std::allocator<in6_addr>_>).
                              _M_impl._M_node.super__List_node_base._M_next ==
                              (_List_node_base *)this_00) {
                            CreateLocalIPList(this);
                          }
                          bVar4 = SetMulticastTTL(this,pRVar8->multicastTTL);
                          this->supportsmulticasting = bVar4;
                          if (maximumpacketsize < 0x10000) {
                            pRVar1 = pRVar8->m_pAbortDesc;
                            if (pRVar1 == (RTPAbortDescriptors *)0x0) {
                              iVar6 = RTPAbortDescriptors::Init(&this->m_abortDesc);
                              if (iVar6 < 0) {
                                close(this->rtpsock);
                                close(this->rtcpsock);
                                goto LAB_00129cb6;
                              }
                              this->m_pAbortDesc = &this->m_abortDesc;
                            }
                            else {
                              this->m_pAbortDesc = pRVar1;
                              if (pRVar1->m_init == false) {
                                close(this->rtpsock);
                                iVar6 = -0xae;
                                close(this->rtcpsock);
                                goto LAB_00129cb6;
                              }
                            }
                            this->maxpacksize = maximumpacketsize;
                            this->portbase =
                                 *(uint16_t *)&(pRVar8->super_RTPTransmissionParams).field_0xc;
                            this->multicastTTL = pRVar8->multicastTTL;
                            *(undefined4 *)((long)&this->localhostnamelength + 4) = 0;
                            *(undefined8 *)&this->receivemode = 0;
                            *(undefined8 *)((long)&this->localhostname + 4) = 0;
                            this->created = true;
                            this->waitingfordata = false;
                            iVar6 = 0;
                          }
                          else {
                            close(this->rtpsock);
                            close(this->rtcpsock);
                            iVar6 = -0x75;
                          }
                        }
                        else {
                          close(this->rtpsock);
                          close(this->rtcpsock);
                          iVar6 = -0x61;
                        }
                      }
                      else {
                        close(this->rtpsock);
                        close(this->rtcpsock);
                        iVar6 = -0x62;
                      }
                    }
                    else {
                      close(this->rtpsock);
                      close(this->rtcpsock);
                      iVar6 = -0x66;
                    }
                  }
                  else {
                    close(this->rtpsock);
                    close(this->rtcpsock);
                    iVar6 = -0x65;
                  }
                }
                else {
                  close(this->rtpsock);
                  close(this->rtcpsock);
                  iVar6 = -0x68;
                }
              }
              else {
                close(this->rtpsock);
                close(this->rtcpsock);
                iVar6 = -0x67;
              }
            }
          }
        }
        else {
          iVar6 = -0x74;
        }
      }
      else {
        iVar6 = -0x6b;
      }
    }
    else {
      iVar6 = -0x5e;
    }
  }
  else {
    iVar6 = -0x72;
  }
LAB_00129cb6:
  RTPUDPv6TransmissionParams::~RTPUDPv6TransmissionParams(&defaultparams);
  return iVar6;
}

Assistant:

int RTPUDPv6Transmitter::Create(size_t maximumpacketsize,const RTPTransmissionParams *transparams)
{
	const RTPUDPv6TransmissionParams *params,defaultparams;
	struct sockaddr_in6 addr;
	RTPSOCKLENTYPE size;
	int status;

	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_ALREADYCREATED;
	}
	
	// Obtain transmission parameters
	
	if (transparams == 0)
		params = &defaultparams;
	else
	{
		if (transparams->GetTransmissionProtocol() != RTPTransmitter::IPv6UDPProto)
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_ILLEGALPARAMETERS;
		}
		params = (const RTPUDPv6TransmissionParams *)transparams;
	}

	// Check if portbase is even
	if (params->GetPortbase()%2 != 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_PORTBASENOTEVEN;
	}

	// create sockets
	
	rtpsock = socket(PF_INET6,SOCK_DGRAM,0);
	if (rtpsock == RTPSOCKERR)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTCREATESOCKET;
	}
	rtcpsock = socket(PF_INET6,SOCK_DGRAM,0);
	if (rtcpsock == RTPSOCKERR)
	{
		RTPCLOSE(rtpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTCREATESOCKET;
	}
	
	// set socket buffer sizes
	
	size = params->GetRTPReceiveBuffer();
	if (setsockopt(rtpsock,SOL_SOCKET,SO_RCVBUF,(const char *)&size,sizeof(int)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTSETRTPRECEIVEBUF;
	}
	size = params->GetRTPSendBuffer();
	if (setsockopt(rtpsock,SOL_SOCKET,SO_SNDBUF,(const char *)&size,sizeof(int)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTSETRTPTRANSMITBUF;
	}
	size = params->GetRTCPReceiveBuffer();
	if (setsockopt(rtcpsock,SOL_SOCKET,SO_RCVBUF,(const char *)&size,sizeof(int)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTSETRTCPRECEIVEBUF;
	}
	size = params->GetRTCPSendBuffer();
	if (setsockopt(rtcpsock,SOL_SOCKET,SO_SNDBUF,(const char *)&size,sizeof(int)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTSETRTCPTRANSMITBUF;
	}
	
	// bind sockets

	bindIP = params->GetBindIP();
	mcastifidx = params->GetMulticastInterfaceIndex();
	
	memset(&addr,0,sizeof(struct sockaddr_in6));
	addr.sin6_family = AF_INET6;
	addr.sin6_port = htons(params->GetPortbase());
	addr.sin6_addr = bindIP;
	if (bind(rtpsock,(struct sockaddr *)&addr,sizeof(struct sockaddr_in6)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTBINDRTPSOCKET;
	}
	memset(&addr,0,sizeof(struct sockaddr_in6));
	addr.sin6_family = AF_INET6;
	addr.sin6_port = htons(params->GetPortbase()+1);
	addr.sin6_addr = bindIP;
	if (bind(rtcpsock,(struct sockaddr *)&addr,sizeof(struct sockaddr_in6)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTBINDRTCPSOCKET;
	}

	// Try to obtain local IP addresses

	localIPs = params->GetLocalIPList();
	if (localIPs.empty()) // User did not provide list of local IP addresses, calculate them
	{
		int status;
		
		if ((status = CreateLocalIPList()) < 0)
		{
			RTPCLOSE(rtpsock);
			RTPCLOSE(rtcpsock);
			MAINMUTEX_UNLOCK
			return status;
		}

#ifdef RTPDEBUG
		std::cout << "Found these local IP addresses:" << std::endl;
		
		std::list<in6_addr>::const_iterator it;

		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			RTPIPv6Address a(*it);

			std::cout << a.GetAddressString() << std::endl;
		}
#endif // RTPDEBUG
	}

#ifdef RTP_SUPPORT_IPV6MULTICAST
	if (SetMulticastTTL(params->GetMulticastTTL()))
		supportsmulticasting = true;
	else
		supportsmulticasting = false;
#else // no multicast support enabled
	supportsmulticasting = false;
#endif // RTP_SUPPORT_IPV6MULTICAST

	if (maximumpacketsize > RTPUDPV6TRANS_MAXPACKSIZE)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_SPECIFIEDSIZETOOBIG;
	}
	
	if (!params->GetCreatedAbortDescriptors())
	{
		if ((status = m_abortDesc.Init()) < 0)
		{
			RTPCLOSE(rtpsock);
			RTPCLOSE(rtcpsock);
			MAINMUTEX_UNLOCK
			return status;
		}
		m_pAbortDesc = &m_abortDesc;
	}
	else
	{
		m_pAbortDesc = params->GetCreatedAbortDescriptors();
		if (!m_pAbortDesc->IsInitialized())
		{
			RTPCLOSE(rtpsock);
			RTPCLOSE(rtcpsock);
			MAINMUTEX_UNLOCK
			return ERR_RTP_ABORTDESC_NOTINIT;
		}
	}

	maxpacksize = maximumpacketsize;
	portbase = params->GetPortbase();
	multicastTTL = params->GetMulticastTTL();
	receivemode = RTPTransmitter::AcceptAll;

	localhostname = 0;
	localhostnamelength = 0;

	waitingfordata = false;
	created = true;
	MAINMUTEX_UNLOCK
	return 0;
}